

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O1

void deld(int d,double *C)

{
  double *B;
  double *A;
  ulong uVar1;
  size_t __n;
  
  __n = 0x10;
  B = (double *)malloc(0x10);
  A = (double *)malloc((long)d * 8 + 8);
  *B = 1.0;
  B[1] = -1.0;
  *A = 1.0;
  if (0 < d) {
    uVar1 = 0;
    do {
      uVar1 = uVar1 + 1;
      poly(A,B,C,(int)uVar1,2);
      memcpy(A,C,__n);
      __n = __n + 8;
    } while ((uint)d != uVar1);
  }
  free(B);
  free(A);
  return;
}

Assistant:

void deld(int d, double* C) {
	int i,j;
	double *vec,*oup;
	/*
	 * deld returns coefficients of [1,-1]^d
	 * eg.,
	 * d=2 yields [1,-2,1]
	 * d=3 [1,-3,3,1]
	 */ 
	vec = (double*) malloc(sizeof(double) * 2);
	oup = (double*) malloc(sizeof(double) * (d+1));
	vec[0] = 1.;
	vec[1] = -1.;
	oup[0] = 1.;
	// oup has length (d+1)
	
	for(i = 0; i < d; ++i) {
		poly(oup,vec,C,i+1,2);
		for(j = 0; j < i+2; ++j) {
			oup[j] = C[j];
		}
		
	}
	free(vec);
	free(oup);
}